

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX50::Message::Message(Message *this,MsgType *msgtype)

{
  Header *this_00;
  allocator<char> local_131;
  STRING local_130;
  FieldBase local_110;
  allocator<char> local_99;
  STRING local_98;
  BeginString local_78;
  MsgType *local_18;
  MsgType *msgtype_local;
  Message *this_local;
  
  local_18 = msgtype;
  msgtype_local = (MsgType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"FIXT.1.1",&local_99);
  FIX::BeginString::BeginString(&local_78,&local_98);
  FIX::Message::Message(&this->super_Message,&local_78,local_18);
  FIX::BeginString::~BeginString(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  *(undefined ***)this = &PTR__Message_0045ed68;
  this_00 = getHeader(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"7",&local_131);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_110,&local_130);
  FIX::FieldMap::setField((FieldMap *)this_00,&local_110,true);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     { getHeader().setField( FIX::ApplVerID("7") ); }